

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerSettings.cpp
# Opt level: O2

void __thiscall HdlcAnalyzerSettings::HdlcAnalyzerSettings(HdlcAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_01;
  auto_ptr<AnalyzerSettingInterfaceInteger> *this_02;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_03;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_04;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_05;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_06;
  AnalyzerSettingInterfaceChannel *this_07;
  AnalyzerSettingInterfaceInteger *this_08;
  AnalyzerSettingInterfaceNumberList *pAVar1;
  Channel *pCVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__HdlcAnalyzerSettings_00114d78;
  this_00 = &this->mInputChannel;
  uVar3 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mBitRate = 2000000;
  this->mTransmissionMode = HDLC_TRANSMISSION_BIT_SYNC;
  this->mHdlcAddr = HDLC_BASIC_ADDRESS_FIELD;
  this->mHdlcControl = HDLC_BASIC_CONTROL_FIELD;
  this->mHdlcFcs = HDLC_CRC16;
  this_01 = &this->mInputChannelInterface;
  this_02 = &this->mBitRateInterface;
  this_03 = &this->mHdlcAddrInterface;
  this_04 = &this->mHdlcTransmissionInterface;
  this_05 = &this->mHdlcControlInterface;
  this_06 = &this->mHdlcFcsInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mHdlcAddrInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mHdlcTransmissionInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mHdlcControlInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mHdlcFcsInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  this_07 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_07);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_01,this_07);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01->_M_ptr,"HDLC");
  pCVar2 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01->_M_ptr);
  this_08 = (AnalyzerSettingInterfaceInteger *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar2);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(this_08);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(this_02,this_08);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"Baud Rate");
  AnalyzerSettingInterfaceInteger::SetMax((int)this_02->_M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)this_02->_M_ptr);
  uVar3 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar3);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_04,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_04->_M_ptr,"Transmission Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_04->_M_ptr,"Bit Synchronous");
  pcVar4 = "Byte Asynchronous";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_04->_M_ptr,"Byte Asynchronous");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTransmissionMode);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_03,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03->_M_ptr,"Address Field Type");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_03->_M_ptr,"Basic");
  pcVar4 = "Extended";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_03->_M_ptr,"Extended");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcAddr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_05,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_05->_M_ptr,"Control Field Format");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_05->_M_ptr,"Basic - Modulo 8");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_05->_M_ptr,"Extended - Modulo 128")
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)this_05->_M_ptr,"Extended - Modulo 32768");
  pcVar4 = "Extended - Modulo 2147483648";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)this_05->_M_ptr,"Extended - Modulo 2147483648");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcControl);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_06,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_06->_M_ptr,"FCS Type");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_06->_M_ptr,"CRC-8");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_06->_M_ptr,"CRC-16-CCITT");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_06->_M_ptr,"CRC-32");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mHdlcFcs);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar5 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar5,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar5,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

HdlcAnalyzerSettings::HdlcAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mBitRate( 2000000 ),
      mTransmissionMode( HDLC_TRANSMISSION_BIT_SYNC ),
      mHdlcAddr( HDLC_BASIC_ADDRESS_FIELD ),
      mHdlcControl( HDLC_BASIC_CONTROL_FIELD ),
      mHdlcFcs( HDLC_CRC16 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "HDLC", "Standard HDLC" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Baud Rate", "Specify the baud rate in symbols per second." );
    mBitRateInterface->SetMax( 6000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );

    mHdlcTransmissionInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcTransmissionInterface->SetTitleAndTooltip( "Transmission Mode", "Specify the transmission mode of the HDLC frames" );
    mHdlcTransmissionInterface->AddNumber( HDLC_TRANSMISSION_BIT_SYNC, "Bit Synchronous", "Bit-oriented transmission using bit stuffing" );
    mHdlcTransmissionInterface->AddNumber( HDLC_TRANSMISSION_BYTE_ASYNC, "Byte Asynchronous",
                                           "Byte asynchronous transmission using byte stuffing (Also known as start/stop mode)" );
    mHdlcTransmissionInterface->SetNumber( mTransmissionMode );

    mHdlcAddrInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcAddrInterface->SetTitleAndTooltip( "Address Field Type", "Specify the address field type of an HDLC frame." );
    mHdlcAddrInterface->AddNumber( HDLC_BASIC_ADDRESS_FIELD, "Basic", "Basic Address Field (8 bits)" );
    mHdlcAddrInterface->AddNumber( HDLC_EXTENDED_ADDRESS_FIELD, "Extended", "Extended Address Field (8 or more bits)" );
    mHdlcAddrInterface->SetNumber( mHdlcAddr );

    mHdlcControlInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcControlInterface->SetTitleAndTooltip( "Control Field Format", "Specify the Control Field type of a HDLC frame." );
    mHdlcControlInterface->AddNumber( HDLC_BASIC_CONTROL_FIELD, "Basic - Modulo 8", "Control Field of 8 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_128, "Extended - Modulo 128", "Control Field of 16 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_32768, "Extended - Modulo 32768", "Control Field of 32 bits" );
    mHdlcControlInterface->AddNumber( HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648, "Extended - Modulo 2147483648",
                                      "Control Field of 64 bits" );
    mHdlcControlInterface->SetNumber( mHdlcControl );

    mHdlcFcsInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mHdlcFcsInterface->SetTitleAndTooltip( "FCS Type", "Specify the Frame Check Sequence of an HDLC frame" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC8, "CRC-8", "8-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC16, "CRC-16-CCITT", "16-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->AddNumber( HDLC_CRC32, "CRC-32", "32-bit Cyclic Redundancy Check" );
    mHdlcFcsInterface->SetNumber( mHdlcFcs );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mHdlcTransmissionInterface.get() );
    AddInterface( mHdlcAddrInterface.get() );
    AddInterface( mHdlcControlInterface.get() );
    AddInterface( mHdlcFcsInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "HDLC", false );
}